

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

bb_insn_t_conflict get_def(gen_ctx_t gen_ctx,MIR_reg_t reg,bb_t_conflict bb)

{
  DLIST_in_edge_t *list;
  bb_t_conflict bb_00;
  MIR_context_t ctx;
  MIR_insn_t before;
  bb_insn_t_conflict obj;
  def_tab_el_t el_00;
  def_tab_el_t el_01;
  MIR_op_t obj_00;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  MIR_op_t *ops;
  MIR_insn_t_conflict insn;
  MIR_context_t ctx_00;
  def_tab_el_t el;
  def_tab_el_t tab_el;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  ctx_00 = gen_ctx->ctx;
  el_00._12_4_ = el._12_4_;
  el_00.reg = reg;
  el_00.bb = bb;
  el_00.def = el.def;
  iVar1 = HTAB_def_tab_el_t_do(gen_ctx->ssa_ctx->def_tab,el_00,HTAB_FIND,&tab_el);
  if (iVar1 == 0) {
    list = &bb->in_edges;
    sVar2 = DLIST_in_edge_t_length(list);
    if (sVar2 == 1) {
      bb_00 = list->head->src;
      if (bb_00->index == 0) {
        tab_el.def = get_fake_insn(gen_ctx,gen_ctx->ssa_ctx->arg_bb_insns,reg);
      }
      else {
        tab_el.def = get_def(gen_ctx,reg,bb_00);
      }
    }
    else {
      _MIR_new_var_op(ctx_00,reg);
      ctx = gen_ctx->ctx;
      sVar2 = DLIST_in_edge_t_length(list);
      VARR_MIR_op_ttrunc(gen_ctx->temp_ops,(size_t)ctx_00);
      while( true ) {
        sVar3 = VARR_MIR_op_tlength(gen_ctx->temp_ops);
        if (sVar2 + 1 <= sVar3) break;
        obj_00._8_8_ = uStack_60;
        obj_00.data = (void *)local_68;
        obj_00.u.i = uStack_58;
        obj_00.u.str.s = (char *)uStack_50;
        obj_00.u._16_8_ = uStack_48;
        obj_00.u.mem.disp = uStack_40;
        VARR_MIR_op_tpush(gen_ctx->temp_ops,obj_00);
      }
      ops = VARR_MIR_op_taddr(gen_ctx->temp_ops);
      insn = MIR_new_insn_arr(ctx,MIR_PHI,sVar2 + 1,ops);
      before = ((bb->bb_insns).head)->insn;
      if (*(int *)&before->field_0x18 == 0xb4) {
        gen_add_insn_after(gen_ctx,before,insn);
      }
      else {
        gen_add_insn_before(gen_ctx,before,insn);
      }
      obj = (bb_insn_t_conflict)insn->data;
      insn->ops[0].data = obj;
      VARR_bb_insn_tpush(gen_ctx->ssa_ctx->phis,obj);
      el_01._12_4_ = el._12_4_;
      el_01.reg = reg;
      el_01.bb = bb;
      el_01.def = obj;
      HTAB_def_tab_el_t_do(gen_ctx->ssa_ctx->def_tab,el_01,HTAB_INSERT,&tab_el);
      tab_el.def = obj;
    }
  }
  return tab_el.def;
}

Assistant:

static bb_insn_t get_def (gen_ctx_t gen_ctx, MIR_reg_t reg, bb_t bb) {
  MIR_context_t ctx = gen_ctx->ctx;
  bb_t src;
  bb_insn_t def;
  def_tab_el_t el, tab_el;
  MIR_op_t op;

  el.bb = bb;
  el.reg = reg;
  if (HTAB_DO (def_tab_el_t, def_tab, el, HTAB_FIND, tab_el)) return tab_el.def;
  if (DLIST_LENGTH (in_edge_t, bb->in_edges) == 1) {
    if ((src = DLIST_HEAD (in_edge_t, bb->in_edges)->src)->index == 0) { /* start bb: args */
      return get_fake_insn (gen_ctx, arg_bb_insns, reg);
    }
    return get_def (gen_ctx, reg, DLIST_HEAD (in_edge_t, bb->in_edges)->src);
  }
  op = _MIR_new_var_op (ctx, reg);
  el.def = def = create_phi (gen_ctx, bb, op);
  HTAB_DO (def_tab_el_t, def_tab, el, HTAB_INSERT, tab_el);
  return el.def;
}